

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

void StoreHuffmanCode(VP8LBitWriter *bw,HuffmanTree *huff_tree,HuffmanTreeToken *tokens,
                     HuffmanTreeCode *huffman_code)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint8_t *puVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int symbols [2];
  HuffmanTreeCode huffman_code_1;
  uint8_t code_length_bitdepth [19];
  uint32_t histogram [19];
  uint16_t code_length_bitdepth_symbols [19];
  undefined8 local_110;
  HuffmanTreeCode local_108;
  ulong local_f0;
  byte local_e8 [32];
  uint8_t local_c8 [32];
  uint32_t local_a8 [20];
  uint16_t local_58 [20];
  
  local_110 = 0;
  iVar10 = huffman_code->num_symbols;
  if ((long)iVar10 < 1) {
    iVar13 = 0;
    bVar7 = true;
  }
  else {
    puVar6 = huffman_code->code_lengths;
    uVar11 = 0;
    iVar13 = 0;
    do {
      if (puVar6[uVar11] != '\0') {
        if (iVar13 < 2) {
          *(int *)((long)&local_110 + (long)iVar13 * 4) = (int)uVar11;
        }
        iVar13 = iVar13 + 1;
      }
      uVar11 = uVar11 + 1;
      bVar7 = iVar13 < 3;
    } while ((uVar11 < (ulong)(long)iVar10) && (iVar13 < 3));
  }
  if (iVar13 == 0) {
    if (0x1f < bw->used_) {
      VP8LPutBitsFlushBits(bw);
    }
    bw->bits_ = bw->bits_ | 1L << ((byte)bw->used_ & 0x3f);
    iVar10 = bw->used_ + 4;
  }
  else {
    iVar14 = (int)local_110;
    uVar9 = local_110._4_4_;
    if (!(bool)((int)local_110._4_4_ < 0x100 & bVar7 & (int)local_110 < 0x100)) {
      local_108.code_lengths = local_e8;
      local_e8[0] = 0;
      local_e8[1] = 0;
      local_e8[2] = 0;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = 0;
      local_e8[9] = 0;
      local_e8[10] = 0;
      local_e8[0xb] = 0;
      local_e8[0xc] = 0;
      local_e8[0xd] = 0;
      local_e8[0xe] = 0;
      local_e8[0xf] = 0;
      local_e8[0x10] = 0;
      local_e8[0x11] = 0;
      local_e8[0x12] = 0;
      local_108.codes = local_58;
      local_58[8] = 0;
      local_58[9] = 0;
      local_58[10] = 0;
      local_58[0xb] = 0;
      local_58[0xc] = 0;
      local_58[0xd] = 0;
      local_58[0xe] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      local_58[0xf] = 0;
      local_58[0x10] = 0;
      local_58[0x11] = 0;
      local_58[0x12] = 0;
      local_108.num_symbols = 0x13;
      if (0x1f < bw->used_) {
        VP8LPutBitsFlushBits(bw);
      }
      bw->used_ = bw->used_ + 1;
      uVar9 = VP8LCreateCompressedHuffmanTree(huffman_code,tokens,iVar10);
      local_a8[0x10] = 0;
      local_a8[0x11] = 0;
      local_a8[0x12] = 0;
      local_a8[0xc] = 0;
      local_a8[0xd] = 0;
      local_a8[0xe] = 0;
      local_a8[0xf] = 0;
      local_a8[8] = 0;
      local_a8[9] = 0;
      local_a8[10] = 0;
      local_a8[0xb] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = '\0';
      local_c8[9] = '\0';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      if (0 < (int)uVar9) {
        uVar11 = 0;
        do {
          local_a8[tokens[uVar11].code] = local_a8[tokens[uVar11].code] + 1;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      VP8LCreateHuffmanTree(local_a8,7,local_c8,huff_tree,&local_108);
      uVar11 = 0x13;
      uVar16 = 0x14;
      do {
        if (uVar11 < 5) {
          uVar16 = 4;
          break;
        }
        pbVar1 = &UNK_001b79bf + uVar11;
        uVar11 = uVar11 - 1;
        uVar16 = (ulong)((int)uVar16 - 1);
      } while (local_e8[*pbVar1] == 0);
      if (0x1f < bw->used_) {
        VP8LPutBitsFlushBits(bw);
      }
      bw->bits_ = bw->bits_ | (ulong)((int)uVar16 - 4) << ((byte)bw->used_ & 0x3f);
      bw->used_ = bw->used_ + 4;
      if (0 < (int)uVar16) {
        uVar11 = 0;
        do {
          bVar2 = local_e8[(byte)(&StoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)[uVar11]];
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ | (ulong)bVar2 << ((byte)bw->used_ & 0x3f);
          bw->used_ = bw->used_ + 3;
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
      ClearHuffmanTreeIfOnlyOneSymbol(&local_108);
      lVar12 = (long)(int)uVar9;
      iVar10 = 0;
      uVar17 = uVar9;
      do {
        if (lVar12 < 1) break;
        bVar2 = tokens[lVar12 + -1].code;
        bVar7 = false;
        if ((bVar2 < 0x13) && ((0x60001U >> (bVar2 & 0x1f) & 1) != 0)) {
          uVar17 = uVar17 - 1;
          iVar10 = iVar10 + (uint)local_e8[bVar2];
          bVar7 = true;
          if ((ulong)bVar2 == 0x12) {
            iVar10 = iVar10 + 7;
          }
          else if (bVar2 == 0x11) {
            iVar10 = iVar10 + 3;
          }
        }
        lVar12 = lVar12 + -1;
      } while (bVar7);
      if (0x1f < bw->used_) {
        VP8LPutBitsFlushBits(bw);
      }
      iVar13 = bw->used_;
      bw->bits_ = bw->bits_ | (ulong)(0xc < iVar10 && 1 < (int)uVar17) << ((byte)iVar13 & 0x3f);
      bw->used_ = iVar13 + 1;
      if (0xc < iVar10 && 1 < (int)uVar17) {
        if (uVar17 == 2) {
          if (0x1e < iVar13) {
            VP8LPutBitsFlushBits(bw);
          }
          iVar10 = bw->used_ + 5;
        }
        else {
          uVar9 = uVar17 - 2;
          uVar8 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if (0x1e < iVar13) {
            VP8LPutBitsFlushBits(bw);
          }
          iVar10 = bw->used_;
          bw->bits_ = bw->bits_ | (ulong)(uVar8 >> 1) << ((byte)iVar10 & 0x3f);
          bw->used_ = iVar10 + 3;
          if (0x1c < iVar10) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ | (ulong)uVar9 << ((byte)bw->used_ & 0x3f);
          iVar10 = (uVar8 & 0x1e) + 2 + bw->used_;
        }
        bw->used_ = iVar10;
        uVar9 = uVar17;
      }
      if ((int)uVar9 < 1) {
        return;
      }
      local_f0 = (ulong)uVar9;
      uVar11 = 0;
      do {
        bVar2 = tokens[uVar11].code;
        bVar3 = tokens[uVar11].extra_bits;
        bVar4 = local_108.code_lengths[bVar2];
        if (bVar4 != 0) {
          uVar5 = local_108.codes[bVar2];
          if (0x1f < bw->used_) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ | (ulong)uVar5 << ((byte)bw->used_ & 0x3f);
          bw->used_ = (uint)bVar4 + bw->used_;
        }
        if (bVar2 == 0x12) {
          iVar13 = 7;
          iVar10 = bw->used_;
joined_r0x0013f55b:
          if (0x1f < iVar10) {
            VP8LPutBitsFlushBits(bw);
          }
          bw->bits_ = bw->bits_ | (ulong)bVar3 << ((byte)bw->used_ & 0x3f);
          bw->used_ = iVar13 + bw->used_;
        }
        else {
          if (bVar2 == 0x11) {
            iVar13 = 3;
LAB_0013f51f:
            iVar10 = bw->used_;
            goto joined_r0x0013f55b;
          }
          if (bVar2 == 0x10) {
            iVar13 = 2;
            goto LAB_0013f51f;
          }
        }
        uVar11 = uVar11 + 1;
        if (local_f0 == uVar11) {
          return;
        }
      } while( true );
    }
    uVar11 = local_110 & 0xffffffff;
    if (0x1f < bw->used_) {
      VP8LPutBitsFlushBits(bw);
    }
    iVar10 = bw->used_;
    bw->bits_ = bw->bits_ | 1L << ((byte)iVar10 & 0x3f);
    bw->used_ = iVar10 + 1;
    if (0x1e < iVar10) {
      VP8LPutBitsFlushBits(bw);
    }
    iVar10 = bw->used_;
    bw->bits_ = bw->bits_ | (ulong)(iVar13 - 1) << ((byte)iVar10 & 0x3f);
    bw->used_ = iVar10 + 1;
    if (iVar14 < 2) {
      if (0x1e < iVar10) {
        VP8LPutBitsFlushBits(bw);
      }
      iVar10 = bw->used_;
      bw->used_ = iVar10 + 1;
      iVar15 = 1;
      iVar14 = 1;
    }
    else {
      if (0x1e < iVar10) {
        VP8LPutBitsFlushBits(bw);
      }
      iVar10 = bw->used_;
      bw->bits_ = bw->bits_ | 1L << ((byte)iVar10 & 0x3f);
      bw->used_ = iVar10 + 1;
      iVar15 = 8;
      iVar14 = 8;
    }
    if (0x1e < iVar10) {
      VP8LPutBitsFlushBits(bw);
      iVar14 = iVar15;
    }
    bw->bits_ = bw->bits_ | uVar11 << ((byte)bw->used_ & 0x3f);
    bw->used_ = iVar14 + bw->used_;
    if (iVar13 != 2) {
      return;
    }
    if (0x1f < bw->used_) {
      VP8LPutBitsFlushBits(bw);
    }
    bw->bits_ = bw->bits_ | (ulong)uVar9 << ((byte)bw->used_ & 0x3f);
    iVar10 = bw->used_ + 8;
  }
  bw->used_ = iVar10;
  return;
}

Assistant:

static void StoreHuffmanCode(VP8LBitWriter* const bw,
                             HuffmanTree* const huff_tree,
                             HuffmanTreeToken* const tokens,
                             const HuffmanTreeCode* const huffman_code) {
  int i;
  int count = 0;
  int symbols[2] = { 0, 0 };
  const int kMaxBits = 8;
  const int kMaxSymbol = 1 << kMaxBits;

  // Check whether it's a small tree.
  for (i = 0; i < huffman_code->num_symbols && count < 3; ++i) {
    if (huffman_code->code_lengths[i] != 0) {
      if (count < 2) symbols[count] = i;
      ++count;
    }
  }

  if (count == 0) {   // emit minimal tree for empty cases
    // bits: small tree marker: 1, count-1: 0, large 8-bit code: 0, code: 0
    VP8LPutBits(bw, 0x01, 4);
  } else if (count <= 2 && symbols[0] < kMaxSymbol && symbols[1] < kMaxSymbol) {
    VP8LPutBits(bw, 1, 1);  // Small tree marker to encode 1 or 2 symbols.
    VP8LPutBits(bw, count - 1, 1);
    if (symbols[0] <= 1) {
      VP8LPutBits(bw, 0, 1);  // Code bit for small (1 bit) symbol value.
      VP8LPutBits(bw, symbols[0], 1);
    } else {
      VP8LPutBits(bw, 1, 1);
      VP8LPutBits(bw, symbols[0], 8);
    }
    if (count == 2) {
      VP8LPutBits(bw, symbols[1], 8);
    }
  } else {
    StoreFullHuffmanCode(bw, huff_tree, tokens, huffman_code);
  }
}